

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::iterate(DefaultsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  undefined4 *puVar4;
  undefined1 *local_60;
  GLvoid *data_2;
  GLint64 data_1;
  GLuint i_1;
  GLint data;
  GLuint i;
  GLuint local_34;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  GLuint buffer;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  DefaultsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  buffer = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)buffer);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    local_34 = 0;
    this->m_pNamedBufferData = *(PFNGLNAMEDBUFFERDATA *)(lStack_20 + 0xec0);
    this->m_pGetNamedBufferParameteri64v = *(PFNGLGETNAMEDBUFFERPARAMETERI64V *)(lStack_20 + 0x8f0);
    this->m_pGetNamedBufferParameteriv = *(PFNGLGETNAMEDBUFFERPARAMETERIV *)(lStack_20 + 0x8f8);
    this->m_pGetNamedBufferPointerv = *(PFNGLGETNAMEDBUFFERPOINTERV *)(lStack_20 + 0x900);
    if ((this->m_pNamedBufferData == (PFNGLNAMEDBUFFERDATA)0x0) ||
       (((this->m_pGetNamedBufferParameteri64v == (PFNGLGETNAMEDBUFFERPARAMETERI64V)0x0 ||
         (this->m_pGetNamedBufferParameteriv == (PFNGLGETNAMEDBUFFERPARAMETERIV)0x0)) ||
        (this->m_pGetNamedBufferPointerv == (PFNGLGETNAMEDBUFFERPOINTERV)0x0)))) {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    (**(code **)(lStack_20 + 0x3b8))(1,&local_34);
    err = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(err,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x8fb);
    for (i_1 = 0; i_1 < 9; i_1 = i_1 + 1) {
      data_1._4_4_ = -1;
      (*this->m_pGetNamedBufferParameteriv)
                (local_34,iterate::test_values[i_1].pname,(GLint *)((long)&data_1 + 4));
      bVar1 = CheckParameterError(this,iterate::test_values[i_1].pname_string,
                                  "glGetNamedBufferParameteriv");
      local_2e = bVar1 & local_2e;
      bVar1 = CheckValue<int>(this,data_1._4_4_,iterate::test_values[i_1].expected_data,
                              iterate::test_values[i_1].pname_string,"glGetNamedBufferParameteriv");
      local_2e = (local_2e & 1 & bVar1) != 0;
    }
    for (data_1._0_4_ = 0; (uint)data_1 < 9; data_1._0_4_ = (uint)data_1 + 1) {
      data_2 = &DAT_ffffffffffffffff;
      (*this->m_pGetNamedBufferParameteri64v)
                (local_34,iterate::test_values[(uint)data_1].pname,(GLint64 *)&data_2);
      bVar1 = CheckParameterError(this,iterate::test_values[(uint)data_1].pname_string,
                                  "glGetNamedBufferParameteri64v");
      local_2e = bVar1 & local_2e;
      bVar1 = CheckValue<long>(this,(long)data_2,
                               (long)iterate::test_values[(uint)data_1].expected_data,
                               iterate::test_values[(uint)data_1].pname_string,
                               "glGetNamedBufferParameteri64v");
      local_2e = (local_2e & 1 & bVar1) != 0;
    }
    local_60 = &DAT_00000001;
    (*this->m_pGetNamedBufferPointerv)(local_34,0x88bd,&local_60);
    bVar1 = CheckParameterError(this,"GL_BUFFER_MAP_POINTER","glGetNamedBufferPointer");
    local_2e = bVar1 & local_2e;
    bVar1 = CheckValue<void*>(this,local_60,(void *)0x0,"GL_BUFFER_MAP_POINTER",
                              "glGetNamedBufferParameteriv");
    local_2e = (local_2e & 1 & bVar1) != 0;
    if (local_34 != 0) {
      (**(code **)(lStack_20 + 0x438))(1);
      local_34 = 0;
    }
    do {
      iVar2 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar2 != 0);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DefaultsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pGetNamedBufferParameteri64v) ||
			(DE_NULL == m_pGetNamedBufferParameteriv) || (DE_NULL == m_pGetNamedBufferPointerv))
		{
			throw 0;
		}

		/* Buffer creation. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		/* Test data for glGetNamedBufferParameteri*v. */
		static const struct
		{
			glw::GLenum		   pname;
			const glw::GLchar* pname_string;
			glw::GLint		   expected_data;
		} test_values[] = { { GL_BUFFER_SIZE, "GL_BUFFER_SIZE", 0 },
							{ GL_BUFFER_USAGE, "GL_BUFFER_USAGE", GL_STATIC_DRAW },
							{ GL_BUFFER_ACCESS, "GL_BUFFER_ACCESS", GL_READ_WRITE },
							{ GL_BUFFER_ACCESS_FLAGS, "GL_BUFFER_ACCESS_FLAGS", 0 },
							{ GL_BUFFER_IMMUTABLE_STORAGE, "GL_BUFFER_IMMUTABLE_STORAGE", GL_FALSE },
							{ GL_BUFFER_MAPPED, "GL_BUFFER_MAPPED", GL_FALSE },
							{ GL_BUFFER_MAP_OFFSET, "GL_BUFFER_MAP_OFFSET", 0 },
							{ GL_BUFFER_MAP_LENGTH, "GL_BUFFER_MAP_LENGTH", 0 },
							{ GL_BUFFER_STORAGE_FLAGS, "GL_BUFFER_STORAGE_FLAGS", 0 } };

		static const glw::GLuint test_dictionary_count = sizeof(test_values) / sizeof(test_values[0]);

		/* Test glGetNamedBufferParameteriv. */
		for (glw::GLuint i = 0; i < test_dictionary_count; ++i)
		{
			glw::GLint data = -1;

			m_pGetNamedBufferParameteriv(buffer, test_values[i].pname, &data);

			is_ok &= CheckParameterError(test_values[i].pname_string, "glGetNamedBufferParameteriv");

			is_ok &= CheckValue<glw::GLint>(data, test_values[i].expected_data, test_values[i].pname_string,
											"glGetNamedBufferParameteriv");
		}

		/* Test glGetNamedBufferParameteri64v. */
		for (glw::GLuint i = 0; i < test_dictionary_count; ++i)
		{
			glw::GLint64 data = -1;

			m_pGetNamedBufferParameteri64v(buffer, test_values[i].pname, &data);

			is_ok &= CheckParameterError(test_values[i].pname_string, "glGetNamedBufferParameteri64v");

			is_ok &= CheckValue<glw::GLint64>(data, (glw::GLint64)test_values[i].expected_data,
											  test_values[i].pname_string, "glGetNamedBufferParameteri64v");
		}

		/* Test glGetNamedBufferPointerv. */
		{
			glw::GLvoid* data = (glw::GLvoid*)1;

			m_pGetNamedBufferPointerv(buffer, GL_BUFFER_MAP_POINTER, &data);

			is_ok &= CheckParameterError("GL_BUFFER_MAP_POINTER", "glGetNamedBufferPointer");

			is_ok &= CheckValue<glw::GLvoid*>(data, (glw::GLvoid*)DE_NULL, "GL_BUFFER_MAP_POINTER",
											  "glGetNamedBufferParameteriv");
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}